

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManIncrSimSet(Gia_Man_t *p,Vec_Int_t *vObjLits)

{
  uint uVar1;
  int *piVar2;
  word *pwVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  
  if (vObjLits->nSize < 1) {
    __assert_fail("Vec_IntSize(vObjLits) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                  ,0x499,"void Gia_ManIncrSimSet(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar5 = p->iTimeStamp + 1;
  p->iTimeStamp = iVar5;
  piVar2 = vObjLits->pArray;
  lVar7 = 0;
  do {
    uVar1 = piVar2[lVar7];
    if ((int)uVar1 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar6 = uVar1 >> 1;
    uVar8 = p->nSimWords * uVar6;
    if (((int)uVar8 < 0) || (p->vSims->nSize <= (int)uVar8)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
    }
    if (p->nObjs <= (int)uVar6) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if ((int)*(uint *)(p->pObjs + uVar6) < 0 || (~*(uint *)(p->pObjs + uVar6) & 0x1fffffff) == 0) {
      if (p->vTimeStamps->nSize <= (int)uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pwVar3 = p->vSims->pArray;
      p->vTimeStamps->pArray[uVar6] = iVar5;
      lVar9 = (long)(p->iPatsPi >> 6);
      uVar4 = pwVar3[(ulong)uVar8 + lVar9];
      uVar6 = p->iPatsPi & 0x3f;
      if ((((uint)(uVar4 >> (sbyte)uVar6) ^ uVar1) & 1) == 0) {
        pwVar3[(ulong)uVar8 + lVar9] = uVar4 ^ 1L << uVar6;
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 < vObjLits->nSize);
  iVar5 = 0;
  if (p->iPatsPi != p->nSimWords * 0x40 + -1) {
    iVar5 = p->iPatsPi + 1;
  }
  p->iPatsPi = iVar5;
  return;
}

Assistant:

void Gia_ManIncrSimSet( Gia_Man_t * p, Vec_Int_t * vObjLits )
{
    int i, iLit; 
    assert( Vec_IntSize(vObjLits) > 0 );
    p->iTimeStamp++;
    Vec_IntForEachEntry( vObjLits, iLit, i )
    {
        word * pSims = Gia_ManBuiltInData( p, Abc_Lit2Var(iLit) );
        if ( Gia_ObjIsAnd(Gia_ManObj(p, Abc_Lit2Var(iLit))) )
            continue;
        //assert( Vec_IntEntry(p->vTimeStamps, Abc_Lit2Var(iLit)) == p->iTimeStamp-1 );
        Vec_IntWriteEntry(p->vTimeStamps, Abc_Lit2Var(iLit), p->iTimeStamp);
        if ( Abc_TtGetBit(pSims, p->iPatsPi) == Abc_LitIsCompl(iLit) )
             Abc_TtXorBit(pSims, p->iPatsPi);
    }
    p->iPatsPi = (p->iPatsPi == p->nSimWords * 64 - 1) ? 0 : p->iPatsPi + 1;
}